

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dtypes.h
# Opt level: O3

void __thiscall ParameterInfo::ParameterInfo(ParameterInfo *this,ParameterInfo *info)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  Uint8 *__dest;
  float *__dest_00;
  Sint16 *pSVar4;
  float *pfVar5;
  uint uVar6;
  ulong uVar7;
  ulong __n;
  size_t __n_00;
  
  cVar1 = info->name_length;
  this->name_length = cVar1;
  this->group_id = info->group_id;
  this->name = (char *)0x0;
  this->next_offset = info->next_offset;
  bVar2 = info->data_type;
  this->data_type = bVar2;
  __n = (ulong)info->n_dimensions;
  this->n_dimensions = info->n_dimensions;
  this->dimensions = (Uint8 *)0x0;
  this->char_data = (char *)0x0;
  this->int_data = (Sint16 *)0x0;
  this->float_data = (float *)0x0;
  this->descr_length = info->descr_length;
  this->description = (char *)0x0;
  this->locked = info->locked;
  uVar7 = (long)cVar1 + 1;
  pcVar3 = (char *)operator_new__(uVar7);
  this->name = pcVar3;
  memcpy(pcVar3,info->name,uVar7);
  if (info->dimensions == (Uint8 *)0x0) {
    if (bVar2 < 4) {
      if (bVar2 != 1) {
        if (bVar2 != 2) {
          return;
        }
        pSVar4 = (Sint16 *)operator_new__(2);
        this->int_data = pSVar4;
        *pSVar4 = *info->int_data;
        return;
      }
    }
    else {
      if (bVar2 == 4) {
        pfVar5 = (float *)operator_new__(4);
        this->float_data = pfVar5;
        *pfVar5 = *info->float_data;
        return;
      }
      if (bVar2 != 0xff) {
        return;
      }
    }
    pcVar3 = (char *)operator_new__(1);
    this->char_data = pcVar3;
    *pcVar3 = *info->char_data;
    return;
  }
  __dest = (Uint8 *)operator_new__(__n);
  this->dimensions = __dest;
  memcpy(__dest,info->dimensions,__n);
  uVar6 = 1;
  if (__n != 0) {
    uVar7 = 0;
    do {
      uVar6 = uVar6 * __dest[uVar7];
      uVar7 = uVar7 + 1;
    } while (__n != uVar7);
  }
  if (bVar2 < 4) {
    if (bVar2 != 1) {
      if (bVar2 != 2) {
        return;
      }
      __n_00 = (size_t)(uVar6 * 2);
      __dest_00 = (float *)operator_new__(__n_00);
      this->int_data = (Sint16 *)__dest_00;
      pfVar5 = (float *)info->int_data;
      goto LAB_00109795;
    }
  }
  else {
    if (bVar2 == 4) {
      __n_00 = (ulong)uVar6 << 2;
      __dest_00 = (float *)operator_new__(__n_00);
      this->float_data = __dest_00;
      pfVar5 = info->float_data;
      goto LAB_00109795;
    }
    if (bVar2 != 0xff) {
      return;
    }
  }
  __n_00 = (size_t)uVar6;
  __dest_00 = (float *)operator_new__(__n_00);
  this->char_data = (char *)__dest_00;
  pfVar5 = (float *)info->char_data;
LAB_00109795:
  memcpy(__dest_00,pfVar5,__n_00);
  return;
}

Assistant:

ParameterInfo(const ParameterInfo &info) :
		name_length(info.name_length),
		group_id(info.group_id),
		name(NULL),
		next_offset(info.next_offset),
		data_type(info.data_type),
		n_dimensions(info.n_dimensions),
		dimensions(NULL),

		char_data(NULL),
		int_data(NULL),
		float_data(NULL),

		descr_length(info.descr_length),
		description(NULL),
		locked(info.locked)
		{
			// we also need to copy the '\0' character at the end!
			name = new char[name_length + 1];
			memcpy (name, info.name, sizeof(char) * (name_length + 1));

			if (info.dimensions == 0) {
				// if dim == 0 the data comes right away
				if (info.data_type == 1 || info.data_type == -1) {
					char_data = new char[1];
					memcpy (char_data, info.char_data, sizeof (char));
				} else if (info.data_type == 2) {
					int_data = new Sint16[1];
					memcpy (int_data, info.int_data, sizeof (Sint16));
				} else if (info.data_type == 4) {
					float_data = new float[1];
					memcpy (float_data, info.float_data, sizeof (float));
				}
			} else {
				// we first have to read out the dimensions of the values and then we can
				// store the values
				dimensions = new Uint8[info.n_dimensions];

				memcpy(dimensions, info.dimensions, sizeof(Uint8) * n_dimensions);

				int count = 1;
				int i;
				for (i = 0; i < n_dimensions; i++) {
					count *= dimensions[i];
				}

				if (data_type == 1 || data_type == -1) {
					char_data = new char[count];
					memcpy (char_data, info.char_data, sizeof (char) * count);
				} else if (info.data_type == 2) {
					int_data = new Sint16[count];
					memcpy (int_data, info.int_data, sizeof (Sint16) * count);
				} else if (info.data_type == 4) {
					float_data = new float[count];
					memcpy (float_data, info.float_data, sizeof (float) * count);
				}
			}
		}